

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<void_(int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/unittests/compiled_tests.cpp:1034:28)>
::~Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<void_(int_&),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ChaiScript[P]ChaiScript_unittests_compiled_tests_cpp:1034:28)>
           *this)

{
  Proxy_Function_Callable_Impl<void_(int_&),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ChaiScript[P]ChaiScript_unittests_compiled_tests_cpp:1034:28)>
  *this_local;
  
  Proxy_Function_Impl_Base::~Proxy_Function_Impl_Base((Proxy_Function_Impl_Base *)this);
  return;
}

Assistant:

explicit Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr)))
          , m_f(std::move(f)) {
      }